

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O1

double * getDWTmra(wt_object wt,double *wavecoeffs)

{
  int *length;
  int level;
  wave_object pwVar1;
  bool bVar2;
  double *reccoeff;
  int *piVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  level = wt->J;
  lVar5 = (long)level;
  iVar4 = wt->siglength;
  reccoeff = (double *)malloc((lVar5 + 1) * (long)iVar4 * 8);
  pwVar1 = wt->wave;
  length = wt->length;
  getDWTRecCoeff(wt->output,length,"appx",wt->ext,level,level,pwVar1->lpr,pwVar1->hpr,
                 pwVar1->lpr_len,iVar4,reccoeff);
  if (0 < lVar5) {
    iVar4 = wt->siglength;
    lVar6 = 0;
    piVar3 = length;
    do {
      lVar6 = (long)(int)lVar6 + (long)*piVar3;
      pwVar1 = wt->wave;
      getDWTRecCoeff(wt->output + lVar6,length,"det",wt->ext,(int)lVar5,level,pwVar1->lpr,
                     pwVar1->hpr,pwVar1->lpr_len,wt->siglength,reccoeff + iVar4);
      iVar4 = iVar4 + wt->siglength;
      piVar3 = piVar3 + 1;
      bVar2 = 1 < lVar5;
      lVar5 = lVar5 + -1;
    } while (bVar2);
  }
  return reccoeff;
}

Assistant:

double *getDWTmra(wt_object wt, double *wavecoeffs) {
	int i, J, access,N;
	double *mra;
	J = wt->J;
	mra = (double*)malloc(sizeof(double)* wt->siglength*(J + 1));
	access = 0;
	

	// Approximation MRA
	getDWTRecCoeff(wt->output + access, wt->length, "appx", wt->ext, J, J, wt->wave->lpr, wt->wave->hpr, wt->wave->lpr_len, wt->siglength, mra);

	// Details MRA
	N = wt->siglength;
	for (i = J; i > 0; --i) {
		access += wt->length[J - i];
		getDWTRecCoeff(wt->output + access, wt->length, "det", wt->ext, i, J, wt->wave->lpr, wt->wave->hpr, wt->wave->lpr_len, wt->siglength, mra+N);
		N += wt->siglength;
	}
	
	return mra;
}